

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# knn.cpp
# Opt level: O1

void __thiscall KNNClassifier::KNNClassifier(KNNClassifier *this,uint n_neighbors)

{
  (this->matrizX).super_SparseCompressedBase<Eigen::SparseMatrix<double,_1,_int>_>.
  super_SparseMatrixBase<Eigen::SparseMatrix<double,_1,_int>_>.m_isRValue = false;
  (this->matrizX).m_outerSize = -1;
  (this->matrizX).m_innerSize = 0;
  (this->matrizX).m_outerIndex = (StorageIndex *)0x0;
  (this->matrizX).m_innerNonZeros = (StorageIndex *)0x0;
  (this->matrizX).m_data.m_values = (Scalar *)0x0;
  (this->matrizX).m_data.m_indices = (StorageIndex *)0x0;
  (this->matrizX).m_data.m_size = 0;
  (this->matrizX).m_data.m_allocatedSize = 0;
  Eigen::SparseMatrix<double,_1,_int>::resize(&this->matrizX,0,0);
  (this->matrizY).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_data
       = (double *)0x0;
  (this->matrizY).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_rows
       = 0;
  (this->matrizY).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_cols
       = 0;
  this->k = n_neighbors;
  return;
}

Assistant:

KNNClassifier::KNNClassifier(unsigned int n_neighbors)
{
  k = n_neighbors;
}